

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::ComputeSolutionHCurlT<std::complex<double>>
          (TPZCompElHCurl<pzshape::TPZShapeQuad> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<std::complex<double>_> *sol,
          TPZSolVec<std::complex<double>_> *curlSol)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  TPZManVector<std::complex<double>,_10> *pTVar7;
  TNode *pTVar8;
  complex<double> *pcVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  long *plVar13;
  TPZCompMesh *pTVar14;
  TPZFMatrix<std::complex<double>_> *pTVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int coord;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  double extraout_XMM0_Qa;
  long local_a8;
  
  plVar13 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0xb8))();
  (**(code **)(*plVar13 + 0x78))(plVar13);
  iVar12 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0x90))(this);
  pTVar14 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar15 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar14->fSolution);
  lVar6 = (pTVar15->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  (*(sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>)._vptr_TPZVec[3])(sol,lVar6);
  (*(curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>)._vptr_TPZVec[3])(curlSol,lVar6)
  ;
  if (0 < lVar6) {
    lVar18 = 0;
    do {
      pTVar7 = (sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
      (*pTVar7[lVar18].super_TPZVec<std::complex<double>_>._vptr_TPZVec[3])(pTVar7 + lVar18,2);
      pTVar7 = (sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
      lVar16 = pTVar7[lVar18].super_TPZVec<std::complex<double>_>.fNElements;
      if (0 < lVar16) {
        lVar17 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((pTVar7[lVar18].super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar17);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar17 = lVar17 + 0x10;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      pTVar7 = (curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
      (*pTVar7[lVar18].super_TPZVec<std::complex<double>_>._vptr_TPZVec[3])(pTVar7 + lVar18,1);
      pTVar7 = (curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
      lVar16 = pTVar7[lVar18].super_TPZVec<std::complex<double>_>.fNElements;
      if (0 < lVar16) {
        lVar17 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((pTVar7[lVar18].super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar17);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar17 = lVar17 + 0x10;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar6);
  }
  pTVar14 = TPZCompEl::Mesh((TPZCompEl *)this);
  if (0 < iVar12) {
    lVar18 = 0;
    iVar21 = 0;
    do {
      lVar16 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,iVar21);
      pTVar8 = (pTVar14->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      lVar17 = (long)pTVar8[*(int *)(lVar16 + 8)].dim;
      if (0 < lVar17) {
        iVar5 = pTVar8[*(int *)(lVar16 + 8)].pos;
        lVar18 = (long)(int)lVar18;
        local_a8 = 0;
        do {
          if (0 < lVar6) {
            lVar16 = local_a8 + iVar5;
            lVar22 = 0;
            do {
              lVar20 = 0;
              lVar19 = 0;
              do {
                if (((lVar16 < 0) ||
                    ((pTVar15->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                     lVar16)) ||
                   ((pTVar15->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    lVar22)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar10 = *(double *)
                          (pTVar15->fElem
                           [(pTVar15->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                            fRow * lVar22 + lVar16]._M_value + 8);
                if (((lVar18 < 0) ||
                    ((phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar18)) ||
                   ((phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar19)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x278);
                }
                pcVar9 = (sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore[lVar22]
                         .super_TPZVec<std::complex<double>_>.fStore;
                dVar4 = phiHCurl->fElem
                        [(phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar19 +
                         lVar18];
                pdVar2 = (double *)(pcVar9->_M_value + lVar20);
                dVar11 = pdVar2[1];
                pdVar3 = (double *)(pcVar9->_M_value + lVar20);
                *pdVar3 = *pdVar2 + *(double *)
                                     pTVar15->fElem
                                     [(pTVar15->super_TPZMatrix<std::complex<double>_>).
                                      super_TPZBaseMatrix.fRow * lVar22 + lVar16]._M_value * dVar4;
                pdVar3[1] = dVar11 + dVar10 * dVar4;
                lVar19 = lVar19 + 1;
                lVar20 = lVar20 + 0x10;
              } while (lVar19 == 1);
              if (((lVar16 < 0) ||
                  ((pTVar15->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
                   lVar16)) ||
                 ((pTVar15->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                  lVar22)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              dVar10 = *(double *)
                        pTVar15->fElem
                        [(pTVar15->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow
                         * lVar22 + lVar16]._M_value;
              dVar4 = *(double *)
                       (pTVar15->fElem
                        [(pTVar15->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow
                         * lVar22 + lVar16]._M_value + 8);
              (*(curlPhi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x21])(curlPhi,0,lVar18);
              pcVar9 = (curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore
                       [lVar22].super_TPZVec<std::complex<double>_>.fStore;
              dVar11 = *(double *)(pcVar9->_M_value + 8);
              *(double *)pcVar9->_M_value = *(double *)pcVar9->_M_value + extraout_XMM0_Qa * dVar10;
              *(double *)(pcVar9->_M_value + 8) = dVar11 + extraout_XMM0_Qa * dVar4;
              lVar22 = lVar22 + 1;
            } while (lVar22 != lVar6);
          }
          lVar18 = lVar18 + 1;
          local_a8 = local_a8 + 1;
        } while (local_a8 != lVar17);
      }
      iVar21 = iVar21 + 1;
    } while (iVar21 != iVar12);
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}